

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_sub_16_er_d(void)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  uVar1 = *(uint *)((long)m68ki_cpu.dar + uVar2);
  uVar3 = (uint)(ushort)m68ki_cpu.dar[m68ki_cpu.ir & 7];
  uVar4 = (uVar1 & 0xffff) - uVar3;
  m68ki_cpu.x_flag = uVar4 >> 8;
  m68ki_cpu.v_flag = ((uVar4 ^ uVar1) & (uVar1 & 0xffff ^ uVar3)) >> 8;
  m68ki_cpu.not_z_flag = uVar4 & 0xffff;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  *(uint *)((long)m68ki_cpu.dar + uVar2) = uVar1 & 0xffff0000 | m68ki_cpu.not_z_flag;
  return;
}

Assistant:

static void m68k_op_sub_16_er_d(void)
{
	uint* r_dst = &DX;
	uint src = MASK_OUT_ABOVE_16(DY);
	uint dst = MASK_OUT_ABOVE_16(*r_dst);
	uint res = dst - src;

	FLAG_N = NFLAG_16(res);
	FLAG_X = FLAG_C = CFLAG_16(res);
	FLAG_V = VFLAG_SUB_16(src, dst, res);
	FLAG_Z = MASK_OUT_ABOVE_16(res);

	*r_dst = MASK_OUT_BELOW_16(*r_dst) | FLAG_Z;
}